

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_nullmutex>::set_formatter
          (ansicolor_sink<spdlog::details::console_nullmutex> *this,
          unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *sink_formatter)

{
  lock_guard<spdlog::details::null_mutex> *in_RSI;
  mutex_type *in_RDI;
  lock_guard<spdlog::details::null_mutex> lock;
  
  std::lock_guard<spdlog::details::null_mutex>::lock_guard(in_RSI,in_RDI);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator=
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)in_RSI,
             (unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)in_RDI);
  std::lock_guard<spdlog::details::null_mutex>::~lock_guard
            ((lock_guard<spdlog::details::null_mutex> *)0x1a0abc);
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_formatter(std::unique_ptr<spdlog::formatter> sink_formatter)
{
    std::lock_guard<mutex_t> lock(mutex_);
    formatter_ = std::move(sink_formatter);
}